

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::processLocalCommandInstruction(CoreBroker *this,ActionMessage *message)

{
  string_view str;
  string_view str_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  string_view str_01;
  string_view string2;
  string_view string1;
  string_view name;
  string_view fmt;
  string_view message_00;
  string_view newFederate;
  string_view newFederate_00;
  string_view newFederate_01;
  string_view newFederate_02;
  bool bVar1;
  type_conflict *ptVar2;
  type *this_00;
  char *pcVar3;
  Time TVar4;
  reference pvVar5;
  size_type sVar6;
  string *psVar7;
  long in_RSI;
  CoreBroker *in_RDI;
  __sv_type _Var8;
  __sv_type _Var9;
  ActionMessage warn;
  string warnString;
  ActionMessage barrier_1;
  ActionMessage barrier;
  type *res;
  type_conflict *processed;
  double in_stack_fffffffffffffa68;
  ActionMessage *in_stack_fffffffffffffa70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa78;
  time_units defUnit;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  BrokerBase *pBVar10;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 uVar11;
  action_t in_stack_fffffffffffffa8c;
  int iVar12;
  GlobalFederateId in_stack_fffffffffffffa90;
  GlobalFederateId in_stack_fffffffffffffa94;
  SmallBuffer *in_stack_fffffffffffffa98;
  char *in_stack_fffffffffffffaa0;
  size_t in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffab8;
  string_view in_stack_fffffffffffffad0;
  GlobalFederateId local_514 [2];
  undefined4 local_50c;
  ActionMessage *in_stack_fffffffffffffb58;
  CoreBroker *in_stack_fffffffffffffb60;
  ActionMessage *pAStack_448;
  GlobalBrokerId id;
  GlobalFederateId in_stack_fffffffffffffbd4;
  char *pcVar13;
  char *pcVar14;
  undefined1 local_418 [4];
  GlobalFederateId in_stack_fffffffffffffbec;
  int local_3dc;
  format_args in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffce0;
  size_t in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 uVar15;
  CoreBroker *in_stack_fffffffffffffe58;
  CoreBroker *this_01;
  size_t in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  ActionMessage *in_stack_fffffffffffffe98;
  BrokerBase *in_stack_fffffffffffffea0;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  char *pcStack_40;
  reference local_30;
  char *local_28;
  char *pcStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  uVar15 = (undefined1)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  BrokerBase::processBaseCommands(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  ptVar2 = std::
           get<0ul,bool,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                     ((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       *)0x55a54a);
  this_00 = std::
            get<1ul,bool,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                      ((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        *)0x55a55f);
  if ((*ptVar2 & 1U) == 0) {
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)this_00,0);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               (char *)in_stack_fffffffffffffa78);
    __x._M_str = in_stack_fffffffffffffaa0;
    __x._M_len = (size_t)in_stack_fffffffffffffa98;
    __y._M_len._4_4_ = in_stack_fffffffffffffa8c;
    __y._M_len._0_4_ = in_stack_fffffffffffffa88;
    __y._M_str._0_4_ = in_stack_fffffffffffffa90.gid;
    __y._M_str._4_4_ = in_stack_fffffffffffffa94.gid;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      sVar6 = CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this_00);
      pcVar3 = (char *)(sVar6 - 1);
      switch(pcVar3) {
      case (char *)0x0:
        break;
      case (char *)0x1:
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this_00,1);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (char *)in_stack_fffffffffffffa78);
        __x_00._M_str = in_stack_fffffffffffffaa0;
        __x_00._M_len = (size_t)in_stack_fffffffffffffa98;
        __y_00._M_len._4_4_ = in_stack_fffffffffffffa8c;
        __y_00._M_len._0_4_ = in_stack_fffffffffffffa88;
        __y_00._M_str._0_4_ = in_stack_fffffffffffffa90.gid;
        __y_00._M_str._4_4_ = in_stack_fffffffffffffa94.gid;
        bVar1 = std::operator==(__x_00,__y_00);
        if (!bVar1) {
          CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)this_00,1);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (char *)in_stack_fffffffffffffa78);
          __x_01._M_str = in_stack_fffffffffffffaa0;
          __x_01._M_len = (size_t)in_stack_fffffffffffffa98;
          __y_01._M_len._4_4_ = in_stack_fffffffffffffa8c;
          __y_01._M_len._0_4_ = in_stack_fffffffffffffa88;
          __y_01._M_str._0_4_ = in_stack_fffffffffffffa90.gid;
          __y_01._M_str._4_4_ = in_stack_fffffffffffffa94.gid;
          bVar1 = std::operator==(__x_01,__y_01);
          if (!bVar1) {
            CLI::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)this_00,1);
            newFederate_00._M_str = in_stack_fffffffffffffe68;
            newFederate_00._M_len = in_stack_fffffffffffffe60;
            loadTimeMonitor(in_stack_fffffffffffffe58,(bool)uVar15,newFederate_00);
            break;
          }
        }
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (char *)in_stack_fffffffffffffa78);
        newFederate._M_str = in_stack_fffffffffffffe68;
        newFederate._M_len = in_stack_fffffffffffffe60;
        loadTimeMonitor(in_stack_fffffffffffffe58,(bool)uVar15,newFederate);
        break;
      case (char *)0x2:
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this_00,2);
        str._M_len._4_4_ = in_stack_fffffffffffffa84;
        str._M_len._0_4_ = in_stack_fffffffffffffa80;
        str._M_str._0_4_ = in_stack_fffffffffffffa88;
        str._M_str._4_4_ = in_stack_fffffffffffffa8c;
        TVar4 = loadTimeFromString(str,(time_units)((ulong)in_stack_fffffffffffffa78 >> 0x20));
        (in_RDI->mTimeMonitorPeriod).internalTimeCode = TVar4.internalTimeCode;
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this_00,1);
        newFederate_01._M_str = in_stack_fffffffffffffe68;
        newFederate_01._M_len = in_stack_fffffffffffffe60;
        loadTimeMonitor(in_stack_fffffffffffffe58,(bool)uVar15,newFederate_01);
        break;
      case (char *)0x3:
      default:
        pvVar5 = CLI::std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)this_00,2);
        defUnit = (time_units)((ulong)in_stack_fffffffffffffa78 >> 0x20);
        this_01 = (CoreBroker *)pvVar5->_M_len;
        pcVar13 = pvVar5->_M_str;
        pvVar5 = CLI::std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)this_00,3);
        uVar15 = (undefined1)((ulong)pvVar5->_M_str >> 0x38);
        string1._M_str = pcVar3;
        string1._M_len = in_stack_fffffffffffffab8;
        string2._M_str = in_stack_fffffffffffffab0;
        string2._M_len = in_stack_fffffffffffffaa8;
        gmlc::utilities::string_viewOps::merge(string1,string2);
        str_00._M_len._4_4_ = in_stack_fffffffffffffa84;
        str_00._M_len._0_4_ = in_stack_fffffffffffffa80;
        str_00._M_str._0_4_ = in_stack_fffffffffffffa88;
        str_00._M_str._4_4_ = in_stack_fffffffffffffa8c;
        TVar4 = loadTimeFromString(str_00,defUnit);
        (in_RDI->mTimeMonitorPeriod).internalTimeCode = TVar4.internalTimeCode;
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this_00,1);
        newFederate_02._M_str = in_stack_fffffffffffffe68;
        newFederate_02._M_len = (size_t)pcVar13;
        loadTimeMonitor(this_01,(bool)uVar15,newFederate_02);
      }
    }
    else {
      CLI::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)this_00,0);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (char *)in_stack_fffffffffffffa78);
      __x_02._M_str = in_stack_fffffffffffffaa0;
      __x_02._M_len = (size_t)in_stack_fffffffffffffa98;
      __y_02._M_len._4_4_ = in_stack_fffffffffffffa8c;
      __y_02._M_len._0_4_ = in_stack_fffffffffffffa88;
      __y_02._M_str._0_4_ = in_stack_fffffffffffffa90.gid;
      __y_02._M_str._4_4_ = in_stack_fffffffffffffa94.gid;
      bVar1 = std::operator==(__x_02,__y_02);
      if ((bVar1) &&
         (sVar6 = CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)this_00), 2 < sVar6)) {
        CLI::std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)this_00,1);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (char *)in_stack_fffffffffffffa78);
        __x_03._M_str = in_stack_fffffffffffffaa0;
        __x_03._M_len = (size_t)in_stack_fffffffffffffa98;
        __y_03._M_len._4_4_ = in_stack_fffffffffffffa8c;
        __y_03._M_len._0_4_ = in_stack_fffffffffffffa88;
        __y_03._M_str._0_4_ = in_stack_fffffffffffffa90.gid;
        __y_03._M_str._4_4_ = in_stack_fffffffffffffa94.gid;
        bVar1 = std::operator==(__x_03,__y_03);
        if (bVar1) {
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffa94.gid,in_stack_fffffffffffffa90.gid),
                     in_stack_fffffffffffffa8c);
          CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)this_00,2);
          gmlc::utilities::numeric_conversionComplete<double>
                    (in_stack_fffffffffffffad0,(double)in_RDI);
          iVar12 = (int)((ulong)in_RDI >> 0x20);
          TimeRepresentation<count_time<9,_long>_>::operator=
                    ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffa70,
                     in_stack_fffffffffffffa68);
          sVar6 = CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)this_00);
          if (3 < sVar6) {
            CLI::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)this_00,3);
            gmlc::utilities::numeric_conversionComplete<int>(in_stack_fffffffffffffad0,iVar12);
          }
          generateTimeBarrier(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          ActionMessage::~ActionMessage(in_stack_fffffffffffffa70);
          goto LAB_0055aff5;
        }
      }
      pvVar5 = CLI::std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)this_00,0);
      pcVar3 = pvVar5->_M_str;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 (char *)in_stack_fffffffffffffa78);
      __x_04._M_str = in_stack_fffffffffffffaa0;
      __x_04._M_len = (size_t)in_stack_fffffffffffffa98;
      __y_04._M_len._4_4_ = in_stack_fffffffffffffa8c;
      __y_04._M_len._0_4_ = in_stack_fffffffffffffa88;
      __y_04._M_str._0_4_ = in_stack_fffffffffffffa90.gid;
      __y_04._M_str._4_4_ = in_stack_fffffffffffffa94.gid;
      bVar1 = std::operator==(__x_04,__y_04);
      if ((bVar1) &&
         (sVar6 = CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)this_00), 1 < sVar6)) {
        pvVar5 = CLI::std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)this_00,1);
        in_stack_fffffffffffffce8 = pvVar5->_M_len;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (char *)in_stack_fffffffffffffa78);
        __x_05._M_str = in_stack_fffffffffffffaa0;
        __x_05._M_len = (size_t)in_stack_fffffffffffffa98;
        __y_05._M_len._4_4_ = in_stack_fffffffffffffa8c;
        __y_05._M_len._0_4_ = in_stack_fffffffffffffa88;
        __y_05._M_str._0_4_ = in_stack_fffffffffffffa90.gid;
        __y_05._M_str._4_4_ = in_stack_fffffffffffffa94.gid;
        bVar1 = std::operator==(__x_05,__y_05);
        if (bVar1) {
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffa94.gid,in_stack_fffffffffffffa90.gid),
                     in_stack_fffffffffffffa8c);
          iVar12 = (int)((ulong)in_RDI >> 0x20);
          setActionFlag<helics::ActionMessage,helics::OperationFlags>
                    ((ActionMessage *)&stack0xfffffffffffffc20,cancel_flag);
          sVar6 = CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)this_00);
          if (2 < sVar6) {
            CLI::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)this_00,2);
            local_3dc = gmlc::utilities::numeric_conversionComplete<int>
                                  (in_stack_fffffffffffffad0,iVar12);
          }
          generateTimeBarrier(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          ActionMessage::~ActionMessage(in_stack_fffffffffffffa70);
          goto LAB_0055aff5;
        }
      }
      pcVar13 = " unrecognized command instruction \"{}\"";
      pcVar14 = (char *)0x26;
      local_30 = CLI::std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)this_00,0);
      local_18 = local_418;
      local_48 = pcVar13;
      pcStack_40 = pcVar14;
      local_28 = pcVar13;
      pcStack_20 = pcVar14;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)
                 CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 in_stack_fffffffffffffa78);
      local_8 = &local_58;
      local_10 = local_68;
      local_58 = 0xd;
      fmt.size_ = in_stack_fffffffffffffce8;
      fmt.data_ = in_stack_fffffffffffffce0;
      local_50 = local_10;
      ::fmt::v11::vformat_abi_cxx11_(fmt,in_stack_fffffffffffffcd0);
      pBVar10 = &in_RDI->super_BrokerBase;
      id.gid = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffbd4,id);
      psVar7 = getIdentifier_abi_cxx11_(in_RDI);
      uVar11 = SUB84(psVar7,0);
      iVar12 = (int)((ulong)psVar7 >> 0x20);
      _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa70);
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa70);
      pAStack_448 = (ActionMessage *)_Var9._M_str;
      name._M_str = pcVar14;
      name._M_len = (size_t)pcVar13;
      message_00._M_str = in_stack_fffffffffffffd18;
      message_00._M_len = (size_t)pcVar3;
      BrokerBase::sendToLogger
                ((BrokerBase *)CONCAT44(in_stack_fffffffffffffbd4.gid,id.gid),
                 in_stack_fffffffffffffbec,_Var8._M_str._4_4_,name,message_00,_Var8._M_str._3_1_);
      bVar1 = GlobalFederateId::operator!=
                        ((GlobalFederateId *)(in_RSI + 8),
                         (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
      if (bVar1) {
        GlobalFederateId::GlobalFederateId
                  (local_514,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
        ActionMessage::ActionMessage
                  ((ActionMessage *)CONCAT44(iVar12,uVar11),(action_t)((ulong)pBVar10 >> 0x20),
                   in_stack_fffffffffffffa94,in_stack_fffffffffffffa90);
        SmallBuffer::operator=
                  (in_stack_fffffffffffffa98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa94.gid,in_stack_fffffffffffffa90.gid));
        local_50c = 3;
        getIdentifier_abi_cxx11_(in_RDI);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_448)
        ;
        str_01._M_str = in_stack_fffffffffffffaa0;
        str_01._M_len = (size_t)in_stack_fffffffffffffa98;
        ActionMessage::setString
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffa94.gid,in_stack_fffffffffffffa90.gid),iVar12,
                   str_01);
        routeMessage((CoreBroker *)
                     CONCAT44(in_stack_fffffffffffffa94.gid,in_stack_fffffffffffffa90.gid),
                     (ActionMessage *)CONCAT44(iVar12,uVar11));
        ActionMessage::~ActionMessage(pAStack_448);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_448);
    }
  }
LAB_0055aff5:
  std::
  pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~pair((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           *)0x55b002);
  return;
}

Assistant:

void CoreBroker::processLocalCommandInstruction(ActionMessage& message)
{
    auto [processed, res] = processBaseCommands(message);
    if (processed) {
        return;
    }

    if (res[0] == "monitor") {
        switch (res.size()) {
            case 1:
                break;
            case 2:
                if (res[1] == "stop" || res[1] == "off") {
                    loadTimeMonitor(false, "");
                } else {
                    loadTimeMonitor(false, res[1]);
                }
                break;
            case 3:
                mTimeMonitorPeriod = loadTimeFromString(res[2], time_units::sec);
                loadTimeMonitor(false, res[1]);
                break;
            case 4:
            default:
                mTimeMonitorPeriod =
                    loadTimeFromString(gmlc::utilities::string_viewOps::merge(res[2], res[3]),
                                       time_units::sec);
                loadTimeMonitor(false, res[1]);
                break;
        }
    } else if ((res[0] == "set") && (res.size() > 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER);
        barrier.actionTime = gmlc::utilities::numeric_conversionComplete<double>(res[2], 0.0);
        if (res.size() >= 4) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[3], 0);
        }

        generateTimeBarrier(barrier);
    } else if ((res[0] == "clear") && (res.size() >= 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER_CLEAR);
        setActionFlag(barrier, cancel_flag);
        if (res.size() >= 3) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[2], 0);
        }
        generateTimeBarrier(barrier);
    } else {
        auto warnString = fmt::format(" unrecognized command instruction \"{}\"", res[0]);
        LOG_WARNING(global_broker_id_local, getIdentifier(), warnString);
        if (message.source_id != global_broker_id_local) {
            ActionMessage warn(CMD_WARNING, global_broker_id_local, message.source_id);
            warn.payload = std::move(warnString);
            warn.messageID = HELICS_LOG_LEVEL_WARNING;
            warn.setString(0, getIdentifier());
            routeMessage(warn);
        }
    }
}